

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

void __thiscall
helics::MessageConditionalOperator::MessageConditionalOperator
          (MessageConditionalOperator *this,
          function<bool_(const_helics::Message_*)> *userConditionalFunction)

{
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageConditionalOperator_0044bd88;
  std::function<bool_(const_helics::Message_*)>::function
            (&this->evalFunction,userConditionalFunction);
  return;
}

Assistant:

MessageConditionalOperator::MessageConditionalOperator(
    std::function<bool(const Message*)> userConditionalFunction):
    evalFunction(std::move(userConditionalFunction))
{
}